

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region,_toml::detail::none_t> * __thiscall
toml::detail::
sequence<toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)10,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>
::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,
          sequence<toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)10,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>
          *this,location *loc,region *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  size_type *psVar1;
  value_type *other;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  undefined1 local_c0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  const_iterator cStack_80;
  result<toml::detail::region,_toml::detail::none_t> local_78;
  
  repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>_>,_toml::detail::sequence<toml::detail::character<'\\'>,_toml::detail::either<toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'b'>,_toml::detail::character<'f'>,_toml::detail::character<'n'>,_toml::detail::character<'r'>,_toml::detail::character<'t'>,_toml::detail::sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>,_toml::detail::sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>_>_>_>,_toml::detail::unlimited>
  ::invoke(&local_78,(location *)this);
  if (local_78.is_ok_ == false) {
    location::reset((location *)this,(const_iterator)reg);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    other = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_78);
    region::operator+=((region *)loc,other);
    local_c0._24_8_ = local_c0 + 0x28;
    local_c0._0_8_ = &PTR__region_001c5698;
    local_c0._8_8_ =
         (loc->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_c0._16_8_ =
         (loc->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (loc->source_).
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (loc->source_).
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    psVar1 = &(loc->source_name_)._M_string_length;
    if ((size_type *)loc->line_number_ == psVar1) {
      local_c0._40_8_ = *psVar1;
      aStack_90._M_allocated_capacity = (loc->source_name_).field_2._M_allocated_capacity;
    }
    else {
      local_c0._40_8_ = *psVar1;
      local_c0._24_8_ = (pointer)loc->line_number_;
    }
    local_c0._32_8_ = (loc->source_name_)._M_dataplus._M_p;
    loc->line_number_ = (size_t)psVar1;
    (loc->source_name_)._M_dataplus._M_p = (pointer)0x0;
    *(undefined1 *)&(loc->source_name_)._M_string_length = 0;
    aStack_90._8_8_ = *(undefined8 *)((long)&(loc->source_name_).field_2 + 8);
    cStack_80._M_current = (loc->iter_)._M_current;
    sequence<toml::detail::character<(char)34>>::
    invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,(sequence<toml::detail::character<(char)34>> *)this,
               (location *)local_c0,reg,first);
    region::~region((region *)local_c0);
  }
  if (local_78.is_ok_ == true) {
    region::~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc, region reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }